

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool ctemplate::Template::StringToTemplateCache(TemplateString *key,TemplateString *content)

{
  int iVar1;
  bool bVar2;
  int i;
  Strip strip;
  bool bVar3;
  
  bVar2 = true;
  strip = DO_NOT_STRIP;
  do {
    iVar1 = g_default_cache_init_once + 1;
    bVar3 = g_default_cache_init_once == 0;
    g_default_cache_init_once = iVar1;
    if (bVar3) {
      CreateTemplateCache();
    }
    bVar3 = TemplateCache::StringToTemplateCache(g_default_template_cache,key,content,strip);
    if (!bVar3) {
      bVar2 = false;
    }
    strip = strip + STRIP_BLANK_LINES;
  } while (strip != NUM_STRIPS);
  return bVar2;
}

Assistant:

bool Template::StringToTemplateCache(const TemplateString& key,
                                     const TemplateString& content) {
  // We say the insert succeeded only if it succeded for all strip values.
  bool retval = true;
  for (int i = 0; i < static_cast<int>(NUM_STRIPS); ++i) {
    if (!GOOGLE_NAMESPACE::StringToTemplateCache(key, content, static_cast<Strip>(i)))
      retval = false;
  }
  return retval;
}